

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<std::shared_ptr<int>>
          (PromiseError *this,shared_ptr<int> *value)

{
  shared_ptr<int> *this_00;
  shared_ptr<int> *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (shared_ptr<int> *)__cxa_allocate_exception(0x10);
  std::shared_ptr<int>::shared_ptr(this_00,value);
  __cxa_throw(this_00,&std::shared_ptr<int>::typeinfo,std::shared_ptr<int>::~shared_ptr);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }